

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_update_image_data(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_data,opj_image_t *p_output_image)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  opj_tcd_image_v2_t *poVar4;
  uint uVar5;
  void *pvVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  opj_image_comp_t *l_img_comp_dest;
  long in_RCX;
  ulong uVar10;
  OPJ_UINT32 *pOVar11;
  ushort *puVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  opj_image_t *l_image_src;
  int iVar17;
  uint uVar18;
  opj_tcd_tilecomp_v2_t *l_tilec;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  byte *pbVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int local_5c;
  long local_48;
  
  if (*(int *)(p_data + 0x10) != 0) {
    local_48 = *(long *)(p_data + 0x18);
    uVar5 = 0;
    do {
      pvVar6 = *(void **)(in_RCX + 0x30);
      iVar23 = *(int *)(in_RCX + 8);
      iVar21 = *(int *)(in_RCX + 0xc);
      if (pvVar6 == (void *)0x0) {
        pvVar6 = calloc((ulong)(uint)(iVar21 * iVar23),4);
        *(void **)(in_RCX + 0x30) = pvVar6;
        if (pvVar6 == (void *)0x0) {
          return 0;
        }
      }
      uVar10 = (ulong)*(uint *)(local_48 + 0x24);
      *(uint *)(in_RCX + 0x24) = *(uint *)(local_48 + 0x24);
      poVar4 = p_tcd->tcd_image;
      iVar19 = ((*(uint *)(local_48 + 0x18) >> 3) + 1) -
               (uint)((*(uint *)(local_48 + 0x18) & 7) == 0);
      if (iVar19 == 3) {
        iVar19 = 4;
      }
      bVar1 = *(byte *)(in_RCX + 0x28);
      uVar18 = *(uint *)&poVar4[uVar10 * 0x16 + 1].tiles;
      uVar26 = ~(-1 << (bVar1 & 0x1f));
      uVar14 = (int)(*(int *)(in_RCX + 0x10) + uVar26) >> (bVar1 & 0x1f);
      uVar3 = *(uint *)&poVar4[uVar10 * 0x16].tiles;
      uVar27 = (int)(uVar26 + *(int *)(in_RCX + 0x14)) >> (bVar1 & 0x1f);
      iVar20 = uVar18 - uVar3;
      uVar26 = uVar14 + iVar23;
      iVar22 = uVar14 - uVar3;
      if (uVar14 < uVar3) {
        local_5c = uVar3 - uVar14;
        iVar22 = 0;
        if (uVar26 < uVar18) {
          iVar17 = iVar20 - (uVar26 - uVar3);
          iVar13 = uVar26 - uVar3;
        }
        else {
          iVar17 = 0;
          iVar13 = iVar20;
        }
      }
      else {
        iVar17 = uVar18 - uVar26;
        if (uVar18 < uVar26 || iVar17 == 0) {
          iVar13 = iVar20 - iVar22;
          iVar17 = 0;
          local_5c = 0;
        }
        else {
          local_5c = 0;
          iVar13 = iVar23;
        }
      }
      uVar3 = *(uint *)((long)&poVar4[uVar10 * 0x16].tiles + 4);
      uVar26 = *(uint *)((long)&poVar4[uVar10 * 0x16 + 1].tiles + 4);
      iVar8 = uVar26 - uVar3;
      uVar18 = iVar21 + uVar27;
      iVar28 = uVar27 - uVar3;
      if (uVar27 < uVar3) {
        iVar16 = uVar3 - uVar27;
        iVar28 = 0;
        if (uVar18 < uVar26) {
          iVar9 = iVar8 - (uVar18 - uVar3);
          iVar8 = uVar18 - uVar3;
        }
        else {
          iVar9 = 0;
        }
      }
      else {
        iVar9 = uVar26 - uVar18;
        if (uVar26 < uVar18 || iVar9 == 0) {
          iVar9 = 0;
          iVar16 = 0;
          iVar8 = iVar8 - iVar28;
        }
        else {
          iVar16 = 0;
          iVar8 = iVar21;
        }
      }
      if (iVar22 < 0) {
        return 0;
      }
      if (iVar28 < 0) {
        return 0;
      }
      if (iVar17 < 0) {
        return 0;
      }
      if (iVar9 < 0) {
        return 0;
      }
      iVar28 = iVar28 * iVar20 + iVar22;
      uVar18 = iVar17 + iVar22;
      iVar22 = iVar9 * iVar20 - iVar22;
      iVar21 = iVar23 - iVar13;
      puVar7 = (uint *)((long)pvVar6 + (long)(iVar16 * iVar23 + local_5c) * 4);
      if (iVar19 == 4) {
        pOVar11 = &p_output_image->x0 + iVar28;
        if (iVar8 != 0) {
          iVar23 = 0;
          do {
            if (iVar13 != 0) {
              lVar24 = 0;
              lVar15 = 0;
              do {
                puVar7[lVar15] = pOVar11[lVar15];
                lVar15 = lVar15 + 1;
                lVar24 = lVar24 + -4;
              } while (iVar13 != (int)lVar15);
              pOVar11 = (OPJ_UINT32 *)((long)pOVar11 - lVar24);
              puVar7 = (uint *)((long)puVar7 - lVar24);
            }
            puVar7 = puVar7 + iVar21;
            pOVar11 = pOVar11 + uVar18;
            iVar23 = iVar23 + 1;
          } while (iVar23 != iVar8);
        }
        p_output_image = (opj_image_t *)(pOVar11 + iVar22);
      }
      else if (iVar19 == 2) {
        puVar12 = (ushort *)((long)&p_output_image->x0 + (long)iVar28 * 2);
        if (*(int *)(local_48 + 0x20) == 0) {
          if (iVar8 != 0) {
            iVar19 = 0;
            iVar23 = iVar13;
            do {
              for (; iVar23 != 0; iVar23 = iVar23 + -1) {
                uVar2 = *puVar12;
                puVar12 = puVar12 + 1;
                *puVar7 = (uint)uVar2;
                puVar7 = puVar7 + 1;
              }
              puVar7 = puVar7 + iVar21;
              puVar12 = puVar12 + uVar18;
              iVar19 = iVar19 + 1;
              iVar23 = iVar13;
            } while (iVar19 != iVar8);
          }
        }
        else if (iVar8 != 0) {
          iVar19 = 0;
          iVar23 = iVar13;
          do {
            for (; iVar23 != 0; iVar23 = iVar23 + -1) {
              uVar2 = *puVar12;
              puVar12 = puVar12 + 1;
              *puVar7 = (int)(short)uVar2;
              puVar7 = puVar7 + 1;
            }
            puVar7 = puVar7 + iVar21;
            puVar12 = puVar12 + uVar18;
            iVar19 = iVar19 + 1;
            iVar23 = iVar13;
          } while (iVar19 != iVar8);
        }
        p_output_image = (opj_image_t *)(puVar12 + iVar22);
      }
      else if (iVar19 == 1) {
        pbVar25 = (byte *)((long)&p_output_image->x0 + (long)iVar28);
        if (*(int *)(local_48 + 0x20) == 0) {
          if (iVar8 != 0) {
            iVar19 = 0;
            iVar23 = iVar13;
            do {
              for (; iVar23 != 0; iVar23 = iVar23 + -1) {
                bVar1 = *pbVar25;
                pbVar25 = pbVar25 + 1;
                *puVar7 = (uint)bVar1;
                puVar7 = puVar7 + 1;
              }
              pbVar25 = pbVar25 + uVar18;
              puVar7 = puVar7 + iVar21;
              iVar19 = iVar19 + 1;
              iVar23 = iVar13;
            } while (iVar19 != iVar8);
          }
        }
        else if (iVar8 != 0) {
          iVar19 = 0;
          iVar23 = iVar13;
          do {
            for (; iVar23 != 0; iVar23 = iVar23 + -1) {
              bVar1 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              *puVar7 = (int)(char)bVar1;
              puVar7 = puVar7 + 1;
            }
            pbVar25 = pbVar25 + uVar18;
            puVar7 = puVar7 + iVar21;
            iVar19 = iVar19 + 1;
            iVar23 = iVar13;
          } while (iVar19 != iVar8);
        }
        p_output_image = (opj_image_t *)(pbVar25 + iVar22);
      }
      in_RCX = in_RCX + 0x38;
      local_48 = local_48 + 0x38;
      p_tcd = (opj_tcd_v2_t *)&p_tcd->tcd_tileno;
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)(p_data + 0x10));
  }
  return 1;
}

Assistant:

opj_bool j2k_update_image_data (opj_tcd_v2_t * p_tcd, OPJ_BYTE * p_data, opj_image_t* p_output_image)
{
	OPJ_UINT32 i,j,k = 0;
	OPJ_UINT32 l_width_src,l_height_src;
	OPJ_UINT32 l_width_dest,l_height_dest;
	OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
	OPJ_INT32 l_start_offset_src, l_line_offset_src, l_end_offset_src ;
	OPJ_UINT32 l_start_x_dest , l_start_y_dest;
	OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
	OPJ_INT32 l_start_offset_dest, l_line_offset_dest;

	opj_image_comp_t * l_img_comp_src = 00;
	opj_image_comp_t * l_img_comp_dest = 00;

	opj_tcd_tilecomp_v2_t * l_tilec = 00;
	opj_image_t * l_image_src = 00;
	OPJ_UINT32 l_size_comp, l_remaining;
	OPJ_INT32 * l_dest_ptr;
	opj_tcd_resolution_v2_t* l_res= 00;

	l_tilec = p_tcd->tcd_image->tiles->comps;
	l_image_src = p_tcd->image;
	l_img_comp_src = l_image_src->comps;

	l_img_comp_dest = p_output_image->comps;

	for (i=0; i<l_image_src->numcomps; i++) {

		/* Allocate output component buffer if necessary */
		if (!l_img_comp_dest->data) {

			l_img_comp_dest->data = (OPJ_INT32*) opj_calloc(l_img_comp_dest->w * l_img_comp_dest->h, sizeof(OPJ_INT32));
			if (! l_img_comp_dest->data) {
				return OPJ_FALSE;
			}
		}

		/* Copy info from decoded comp image to output image */
		l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

		/*-----*/
		/* Compute the precision of the output buffer */
		l_size_comp = l_img_comp_src->prec >> 3; /*(/ 8)*/
		l_remaining = l_img_comp_src->prec & 7;  /* (%8) */
		l_res = l_tilec->resolutions + l_img_comp_src->resno_decoded;

		if (l_remaining) {
			++l_size_comp;
		}

		if (l_size_comp == 3) {
			l_size_comp = 4;
		}
		/*-----*/

		/* Current tile component size*/
		/*if (i == 0) {
		fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
				l_res->x0, l_res->x1, l_res->y0, l_res->y1);
		}*/

		l_width_src = (l_res->x1 - l_res->x0);
		l_height_src = (l_res->y1 - l_res->y0);

		/* Border of the current output component*/
		l_x0_dest = int_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
		l_y0_dest = int_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
		l_x1_dest = l_x0_dest + l_img_comp_dest->w;
		l_y1_dest = l_y0_dest + l_img_comp_dest->h;

		/*if (i == 0) {
		fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
				l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
		}*/

		/*-----*/
		/* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
		 * of the input buffer (decoded tile component) which will be move
		 * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
		 * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
		 * by this input area.
		 * */
		if ( l_x0_dest < l_res->x0 ) {
			l_start_x_dest = l_res->x0 - l_x0_dest;
			l_offset_x0_src = 0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_x1_dest - l_res->x0 ;
				l_offset_x1_src = l_width_src - l_width_dest;
			}
		}
		else {
			l_start_x_dest = 0 ;
			l_offset_x0_src = l_x0_dest - l_res->x0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src - l_offset_x0_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_img_comp_dest->w ;
				l_offset_x1_src = l_res->x1 - l_x1_dest;
			}
		}

		if ( l_y0_dest < l_res->y0 ) {
			l_start_y_dest = l_res->y0 - l_y0_dest;
			l_offset_y0_src = 0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_y1_dest - l_res->y0 ;
				l_offset_y1_src =  l_height_src - l_height_dest;
			}
		}
		else {
			l_start_y_dest = 0 ;
			l_offset_y0_src = l_y0_dest - l_res->y0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src - l_offset_y0_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_img_comp_dest->h ;
				l_offset_y1_src = l_res->y1 - l_y1_dest;
			}
		}

		if( (l_offset_x0_src < 0 ) || (l_offset_y0_src < 0 ) || (l_offset_x1_src < 0 ) || (l_offset_y1_src < 0 ) ){
			return OPJ_FALSE;
		}
		/*-----*/

		/* Compute the input buffer offset */
		l_start_offset_src = l_offset_x0_src + l_offset_y0_src * l_width_src;
		l_line_offset_src = l_offset_x1_src + l_offset_x0_src;
		l_end_offset_src = l_offset_y1_src * l_width_src - l_offset_x0_src;

		/* Compute the output buffer offset */
		l_start_offset_dest = l_start_x_dest + l_start_y_dest * l_img_comp_dest->w;
		l_line_offset_dest = l_img_comp_dest->w - l_width_dest;

		/* Move the output buffer to the first place where we will write*/
		l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

		/*if (i == 0) {
			fprintf(stdout, "COMPO[%d]:\n",i);
			fprintf(stdout, "SRC: l_start_x_src=%d, l_start_y_src=%d, l_width_src=%d, l_height_src=%d\n"
					"\t tile offset:%d, %d, %d, %d\n"
					"\t buffer offset: %d; %d, %d\n",
					l_res->x0, l_res->y0, l_width_src, l_height_src,
					l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src,
					l_start_offset_src, l_line_offset_src, l_end_offset_src);

			fprintf(stdout, "DEST: l_start_x_dest=%d, l_start_y_dest=%d, l_width_dest=%d, l_height_dest=%d\n"
					"\t start offset: %d, line offset= %d\n",
					l_start_x_dest, l_start_y_dest, l_width_dest, l_height_dest, l_start_offset_dest, l_line_offset_dest);
		}*/


		switch (l_size_comp) {
			case 1:
				{
					OPJ_CHAR * l_src_ptr = (OPJ_CHAR*) p_data;
					l_src_ptr += l_start_offset_src; /* Move to the first place where we will read*/

					if (l_img_comp_src->sgnd) {
						for (j = 0 ; j < l_height_dest ; ++j) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) (*(l_src_ptr++)); /* Copy only the data needed for the output image */
							}

							l_dest_ptr+= l_line_offset_dest; /* Move to the next place where we will write */
							l_src_ptr += l_line_offset_src ; /* Move to the next place where we will read */
						}
					}
					else {
						for ( j = 0 ; j < l_height_dest ; ++j ) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) ((*(l_src_ptr++))&0xff);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src;
						}
					}

					l_src_ptr += l_end_offset_src; /* Move to the end of this component-part of the input buffer */
					p_data = (OPJ_BYTE*) l_src_ptr; /* Keep the current position for the next component-part */
				}
				break;
			case 2:
				{
					OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_data;
					l_src_ptr += l_start_offset_src;

					if (l_img_comp_src->sgnd) {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = *(l_src_ptr++);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}
					else {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = (*(l_src_ptr++))&0xffff;
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
			case 4:
				{
					OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_data;
					l_src_ptr += l_start_offset_src;

					for (j=0;j<l_height_dest;++j) {
						for (k=0;k<l_width_dest;++k) {
							*(l_dest_ptr++) = (*(l_src_ptr++));
						}

						l_dest_ptr+= l_line_offset_dest;
						l_src_ptr += l_line_offset_src ;
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
		}

		++l_img_comp_dest;
		++l_img_comp_src;
		++l_tilec;
	}

	return OPJ_TRUE;
}